

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

void __thiscall OpenMD::NameFinder::NameFinder(NameFinder *this,SimInfo *info)

{
  vector<int,_std::allocator<int>_> *this_00;
  int local_1c;
  
  this->info_ = info;
  this_00 = &this->nObjects_;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalBonds_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalBends_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalTorsions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalInversions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalMols_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  loadNames(this);
  return;
}

Assistant:

NameFinder::NameFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    loadNames();
  }